

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

array_type * __thiscall
toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::as_array
          (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this)

{
  string local_38;
  
  if (this->type_ == array) {
    return (array_type *)(this->field_1).integer_;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"toml::value::as_array(): ","");
  detail::
  throw_bad_cast<(toml::value_t)9,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
            (&local_38,this->type_,this);
}

Assistant:

array_type const& as_array() const&
    {
        if(this->type_ != value_t::array)
        {
            detail::throw_bad_cast<value_t::array>(
                    "toml::value::as_array(): ", this->type_, *this);
        }
        return this->array_.value();
    }